

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

void h2o_delegate_request(h2o_req_t *req,h2o_handler_t *current_handler)

{
  h2o_handler_t **pphVar1;
  h2o_handler_t **end;
  h2o_handler_t **handler;
  h2o_handler_t *current_handler_local;
  h2o_req_t *req_local;
  
  end = (req->pathconf->handlers).entries;
  pphVar1 = end + (req->pathconf->handlers).size;
  do {
    if (end == pphVar1) {
LAB_0016a620:
      call_handlers(req,end);
      return;
    }
    if (*end == current_handler) {
      end = end + 1;
      goto LAB_0016a620;
    }
    end = end + 1;
  } while( true );
}

Assistant:

void h2o_delegate_request(h2o_req_t *req, h2o_handler_t *current_handler)
{
    h2o_handler_t **handler = req->pathconf->handlers.entries, **end = handler + req->pathconf->handlers.size;

    for (; handler != end; ++handler) {
        if (*handler == current_handler) {
            ++handler;
            break;
        }
    }
    call_handlers(req, handler);
}